

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O2

int * Ssw_SmlCheckOutputSavePattern(Ssw_Sml_t *p,Aig_Obj_t *pObjPo)

{
  ulong uVar1;
  int *piVar2;
  void *pvVar3;
  Aig_Man_t *pAVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  
  uVar5 = p->nWordsTotal;
  lVar6 = (long)(int)(*(int *)(((ulong)pObjPo->pFanin0 & 0xfffffffffffffffe) + 0x24) * uVar5) * 4;
  uVar7 = 0;
  uVar1 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar1 = uVar7;
  }
  while( true ) {
    if (uVar1 == uVar7) {
      __assert_fail("i < p->nWordsTotal",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                    ,0x1c3,"int *Ssw_SmlCheckOutputSavePattern(Ssw_Sml_t *, Aig_Obj_t *)");
    }
    if (*(int *)((long)&p[1].pAig + uVar7 * 4 + lVar6) != 0) break;
    uVar7 = uVar7 + 1;
  }
  uVar5 = 0;
  while( true ) {
    if (uVar5 == 0x20) {
      __assert_fail("k < 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                    ,0x1c8,"int *Ssw_SmlCheckOutputSavePattern(Ssw_Sml_t *, Aig_Obj_t *)");
    }
    if ((*(uint *)((long)&p[1].pAig + uVar7 * 4 + lVar6) >> (uVar5 & 0x1f) & 1) != 0) break;
    uVar5 = uVar5 + 1;
  }
  pAVar4 = p->pAig;
  piVar2 = (int *)malloc((long)pAVar4->nObjs[2] * 4 + 4);
  for (lVar6 = 0; lVar6 < pAVar4->vCis->nSize; lVar6 = lVar6 + 1) {
    pvVar3 = Vec_PtrEntry(pAVar4->vCis,(int)lVar6);
    piVar2[lVar6] =
         (uint)((*(uint *)((long)&p[1].pAig +
                          uVar7 * 4 + (long)p->nWordsTotal * (long)*(int *)((long)pvVar3 + 0x24) * 4
                          ) >> (uVar5 & 0x1f) & 1) != 0);
    pAVar4 = p->pAig;
  }
  piVar2[pAVar4->nObjs[2]] = pObjPo->Id;
  return piVar2;
}

Assistant:

int * Ssw_SmlCheckOutputSavePattern( Ssw_Sml_t * p, Aig_Obj_t * pObjPo )
{
    Aig_Obj_t * pFanin, * pObjPi;
    unsigned * pSims;
    int i, k, BestPat, * pModel;
    // find the word of the pattern
    pFanin = Aig_ObjFanin0(pObjPo);
    pSims = Ssw_ObjSim(p, pFanin->Id);
    for ( i = 0; i < p->nWordsTotal; i++ )
        if ( pSims[i] )
            break;
    assert( i < p->nWordsTotal );
    // find the bit of the pattern
    for ( k = 0; k < 32; k++ )
        if ( pSims[i] & (1 << k) )
            break;
    assert( k < 32 );
    // determine the best pattern
    BestPat = i * 32 + k;
    // fill in the counter-example data
    pModel = ABC_ALLOC( int, Aig_ManCiNum(p->pAig)+1 );
    Aig_ManForEachCi( p->pAig, pObjPi, i )
    {
        pModel[i] = Abc_InfoHasBit(Ssw_ObjSim(p, pObjPi->Id), BestPat);
//        Abc_Print( 1, "%d", pModel[i] );
    }
    pModel[Aig_ManCiNum(p->pAig)] = pObjPo->Id;
//    Abc_Print( 1, "\n" );
    return pModel;
}